

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateType.cpp
# Opt level: O1

bool __thiscall DIS::AggregateType::operator==(AggregateType *this,AggregateType *rhs)

{
  return ((this->_country == rhs->_country && this->_domain == rhs->_domain) &&
         this->_aggregateKind == rhs->_aggregateKind) &&
         (((this->_extra == rhs->_extra && rhs->_specific == this->_specific) &&
          rhs->_subcategory == this->_subcategory) && rhs->_category == this->_category);
}

Assistant:

bool AggregateType::operator ==(const AggregateType& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_aggregateKind == rhs._aggregateKind) ) ivarsEqual = false;
     if( ! (_domain == rhs._domain) ) ivarsEqual = false;
     if( ! (_country == rhs._country) ) ivarsEqual = false;
     if( ! (_category == rhs._category) ) ivarsEqual = false;
     if( ! (_subcategory == rhs._subcategory) ) ivarsEqual = false;
     if( ! (_specific == rhs._specific) ) ivarsEqual = false;
     if( ! (_extra == rhs._extra) ) ivarsEqual = false;

    return ivarsEqual;
 }